

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorSpeed::ChShaftsMotorSpeed(ChShaftsMotorSpeed *this,ChShaftsMotorSpeed *other)

{
  double dVar1;
  undefined1 auVar2 [64];
  
  ChShaftsCouple::ChShaftsCouple((ChShaftsCouple *)this);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorSpeed_0116f5c8;
  (this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ChVariablesGeneric::ChVariablesGeneric(&this->variable,1);
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0)
  ;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8)
  ;
  auVar2 = ZEXT464(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_01186d30;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar2._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar2._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar2._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar2._48_16_;
  ChVariablesGeneric::operator=(&this->variable,&other->variable);
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &(other->f_speed).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
  this->rot_offset = other->rot_offset;
  dVar1 = other->aux_dtdt;
  this->aux_dt = other->aux_dt;
  this->aux_dtdt = dVar1;
  this->avoid_angle_drift = other->avoid_angle_drift;
  return;
}

Assistant:

ChShaftsMotorSpeed::ChShaftsMotorSpeed(const ChShaftsMotorSpeed& other) : ChShaftsMotorBase(other) {

   this->variable = other.variable;

    this->f_speed = other.f_speed;

    this->rot_offset =other.rot_offset;

    this->aux_dt = other.aux_dt; 
    this->aux_dtdt = other.aux_dtdt;
    
    this->avoid_angle_drift = other.avoid_angle_drift;

}